

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

Timer _fill_random2<phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
                (int64_t cnt,
                parallel_flat_hash_map<long,_long,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>,_4UL,_phmap::NullMutex>
                *hash)

{
  char *pcVar1;
  FILE *__stream;
  size_t sVar2;
  uint64_t mem;
  undefined1 auVar3 [16];
  int local_3c;
  int i;
  int64_t num_loops;
  RSU rsu;
  uint seed;
  parallel_flat_hash_map<long,_long,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>,_4UL,_phmap::NullMutex>
  *hash_local;
  int64_t cnt_local;
  Timer timer;
  
  test = "random";
  rsu.m_index = 0x12b8f;
  unique0x10000180 =
       (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>
        *)hash;
  RSU::RSU((RSU *)((long)&num_loops + 4),0x12b8f,0x12b90);
  Timer::Timer((Timer *)&cnt_local,true);
  inner_cnt = cnt / 10;
  for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
    s_num_keys[local_3c] = 0;
  }
  for (loop_idx = 0; __stream = _stderr, loop_idx < 10; loop_idx = loop_idx + 1) {
    _fill_random_inner_mt<phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
              (inner_cnt,
               (parallel_flat_hash_map<long,_long,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>,_4UL,_phmap::NullMutex>
                *)stack0xffffffffffffffe0,(RSU *)((long)&num_loops + 4));
    pcVar1 = test;
    sVar2 = total_num_keys();
    out(pcVar1,sVar2,(Timer *)&cnt_local,false);
  }
  sVar2 = phmap::priv::
          parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>
          ::size(stack0xffffffffffffffe0);
  auVar3._8_4_ = (int)(sVar2 >> 0x20);
  auVar3._0_8_ = sVar2;
  auVar3._12_4_ = 0x45300000;
  fprintf(__stream,"inserted %.2lfM\n",
          ((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) / 1000000.0);
  pcVar1 = test;
  sVar2 = total_num_keys();
  mem = spp::GetProcessMemoryUsed();
  outmem(pcVar1,sVar2,mem,false);
  return (time_point)(time_point)cnt_local;
}

Assistant:

Timer _fill_random2(int64_t cnt, HT &hash)
{
    test = "random";
    unsigned int seed = 76687;
	RSU rsu(seed, seed + 1);

    Timer timer(true);
    const int64_t num_loops = 10;
    inner_cnt = cnt / num_loops;

    for (int i=0; i<16; ++i)
        s_num_keys[i] = 0;

    for (loop_idx=0; loop_idx<num_loops; ++loop_idx)
    {
#if 1 && MT_SUPPORT
        // multithreaded insert
        _fill_random_inner_mt(inner_cnt, hash, rsu);
#else
        _fill_random_inner(inner_cnt, hash, rsu);
#endif
        out(test, total_num_keys(), timer);
    }
    fprintf(stderr, "inserted %.2lfM\n", (double)hash.size() / 1000000);
    outmem(test, total_num_keys(), spp::GetProcessMemoryUsed());
    return timer;
}